

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool bitset_container_negation_range
                (bitset_container_t *src,int range_start,int range_end,container_t **dst)

{
  int iVar1;
  bitset_container_t *bitset;
  array_container_t *paVar2;
  
  bitset = bitset_container_clone(src);
  bitset_flip_range(bitset->words,range_start,range_end);
  iVar1 = bitset_container_compute_cardinality(bitset);
  bitset->cardinality = iVar1;
  if (iVar1 < 0x1001) {
    paVar2 = array_container_from_bitset(bitset);
    *dst = paVar2;
    bitset_container_free(bitset);
  }
  else {
    *dst = bitset;
  }
  return 0x1000 < iVar1;
}

Assistant:

bool bitset_container_negation_range(
    const bitset_container_t *src,
    const int range_start, const int range_end,
    container_t **dst
){
    // TODO maybe consider density-based estimate
    // and sometimes build result directly as array, with
    // conversion back to bitset if wrong.  Or determine
    // actual result cardinality, then go directly for the known final cont.

    // keep computation using bitsets as long as possible.
    bitset_container_t *t = bitset_container_clone(src);
    bitset_flip_range(t->words, (uint32_t)range_start, (uint32_t)range_end);
    t->cardinality = bitset_container_compute_cardinality(t);

    if (t->cardinality > DEFAULT_MAX_SIZE) {
        *dst = t;
        return true;
    } else {
        *dst = array_container_from_bitset(t);
        bitset_container_free(t);
        return false;
    }
}